

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

WordType llvm::APInt::tcAddPart(WordType *dst,WordType src,uint parts)

{
  WordType *pWVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = parts == 0;
  if ((!bVar5) && (uVar2 = *dst, *dst = *dst + src, CARRY8(uVar2,src))) {
    lVar4 = 1;
    do {
      uVar3 = (uint)lVar4;
      if (parts == uVar3) break;
      pWVar1 = dst + lVar4;
      *pWVar1 = *pWVar1 + 1;
      lVar4 = lVar4 + 1;
    } while (*pWVar1 == 0);
    bVar5 = parts <= uVar3;
  }
  return (ulong)bVar5;
}

Assistant:

APInt::WordType APInt::tcAddPart(WordType *dst, WordType src,
                                 unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    dst[i] += src;
    if (dst[i] >= src)
      return 0; // No need to carry so exit early.
    src = 1; // Carry one to next digit.
  }

  return 1;
}